

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void update_pixels(__m256i *sig)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  __m256i *palVar4;
  __m256i *palVar5;
  int i;
  __m256i *sig_local;
  
  for (i = 0; i < 3; i = i + 1) {
    palVar4 = sig + (i + 1);
    lVar1 = (*palVar4)[1];
    lVar2 = (*palVar4)[2];
    lVar3 = (*palVar4)[3];
    palVar5 = sig + i;
    (*palVar5)[0] = (*palVar4)[0];
    (*palVar5)[1] = lVar1;
    (*palVar5)[2] = lVar2;
    (*palVar5)[3] = lVar3;
    palVar4 = sig + (i + 5);
    lVar1 = (*palVar4)[1];
    lVar2 = (*palVar4)[2];
    lVar3 = (*palVar4)[3];
    palVar5 = sig + (i + 4);
    (*palVar5)[0] = (*palVar4)[0];
    (*palVar5)[1] = lVar1;
    (*palVar5)[2] = lVar2;
    (*palVar5)[3] = lVar3;
  }
  return;
}

Assistant:

static inline void update_pixels(__m256i *sig) {
  int i;
  for (i = 0; i < 3; ++i) {
    sig[i] = sig[i + 1];
    sig[i + 4] = sig[i + 5];
  }
}